

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

int __thiscall QCss::ValueExtractor::extractStyleFeatures(ValueExtractor *this)

{
  long i_00;
  qsizetype qVar1;
  DeclarationData *pDVar2;
  QList<QCss::Declaration> *in_RDI;
  Declaration *decl;
  int i;
  int features;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = 0;
  while( true ) {
    i_00 = (long)iVar3;
    qVar1 = QList<QCss::Declaration>::size(in_RDI);
    if (qVar1 <= i_00) break;
    QList<QCss::Declaration>::at(in_RDI,i_00);
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e9e3
                       );
    if (pDVar2->propertyId == QtStyleFeatures) {
      iVar4 = Declaration::styleFeaturesValue((Declaration *)CONCAT44(iVar4,iVar3));
    }
    iVar3 = iVar3 + 1;
  }
  return iVar4;
}

Assistant:

int ValueExtractor::extractStyleFeatures()
{
    int features = StyleFeature_None;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->propertyId == QtStyleFeatures)
            features = decl.styleFeaturesValue();
    }
    return features;
}